

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::IndirectDispatchBufferStorageTestCase::initTestCaseGlobal
          (IndirectDispatchBufferStorageTestCase *this)

{
  uint uVar1;
  GLenum GVar2;
  GLuint GVar3;
  uint local_38;
  uint n_helper_bo_bytes;
  uint helper_bo_data [4];
  uint local_20;
  uint local_1c [2];
  undefined1 local_11;
  int n_indirect_dispatch_call_arg_bytes;
  bool result;
  IndirectDispatchBufferStorageTestCase *this_local;
  
  local_11 = 1;
  local_1c[1] = 0xc;
  _n_indirect_dispatch_call_arg_bytes = this;
  if (this->m_page_size < 0xc) {
    this->m_dispatch_draw_call_args_start_offset = 0;
    this->m_sparse_bo_size = 0xc;
  }
  else {
    local_1c[0] = this->m_page_size - 4;
    local_20 = 4;
    uVar1 = SparseBufferTestUtilities::alignOffset(local_1c,&local_20);
    this->m_dispatch_draw_call_args_start_offset = uVar1;
    this->m_sparse_bo_size = this->m_dispatch_draw_call_args_start_offset + 0xc;
  }
  helper_bo_data[3] = this->m_page_size;
  uVar1 = SparseBufferTestUtilities::alignOffset(&this->m_sparse_bo_size,helper_bo_data + 3);
  this->m_sparse_bo_size_rounded = uVar1;
  memset(&local_38,0,0x10);
  local_38 = this->m_global_wg_size_x;
  n_helper_bo_bytes = 1;
  helper_bo_data[0] = 1;
  helper_bo_data[1] = 0;
  (*this->m_gl->genBuffers)(1,&this->m_helper_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xaf2);
  (*this->m_gl->bindBuffer)(0x8892,this->m_helper_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xaf5);
  (*this->m_gl->bufferData)(0x8892,0x10,&local_38,0x88e4);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xaf8);
  GVar3 = SparseBufferTestUtilities::createComputeProgram(this->m_gl,&initTestCaseGlobal::cs_body,1)
  ;
  this->m_po = GVar3;
  return this->m_po != 0;
}

Assistant:

bool IndirectDispatchBufferStorageTestCase::initTestCaseGlobal()
{
	bool result = true;

	/* One of the cases the test case implementation needs to support is the scenario
	 * where the indirect call arguments are located on the boundary of two (or more) memory pages,
	 * and some of the pages are not committed.
	 *
	 * There are two scenarios which can happen:
	 *
	 * a) page size >= sizeof(uint) * 3: Allocate two pages, arg start offset: (page_size - 4) aligned to 4.
	 *                                   The alignment is a must, since we'll be feeding the offset to an indirect dispatch call.
	 * b) page size <  sizeof(uint) * 3: Allocate as many pages as needed, disable some of the pages.
	 *
	 * For code clarity, the two cases are handled by separate branches, although they could be easily
	 * merged.
	 */
	const int n_indirect_dispatch_call_arg_bytes = sizeof(unsigned int) * 3;

	if (m_page_size >= n_indirect_dispatch_call_arg_bytes)
	{
		/* Indirect dispatch call args must be aligned to 4 */
		DE_ASSERT(m_page_size >= 4);

		m_dispatch_draw_call_args_start_offset = SparseBufferTestUtilities::alignOffset(m_page_size - 4, 4);
		m_sparse_bo_size = m_dispatch_draw_call_args_start_offset + n_indirect_dispatch_call_arg_bytes;
	}
	else
	{
		m_dispatch_draw_call_args_start_offset = 0;
		m_sparse_bo_size					   = n_indirect_dispatch_call_arg_bytes;
	}

	m_sparse_bo_size_rounded = SparseBufferTestUtilities::alignOffset(m_sparse_bo_size, m_page_size);

	/* Set up the helper buffer object. Its structure is as follows:
	 *
	 * [ 0-11]: Indirect dispatch call args
	 * [12-15]: Atomic counter value storage
	 */
	unsigned int	   helper_bo_data[4] = { 0 };
	const unsigned int n_helper_bo_bytes = sizeof(helper_bo_data);

	helper_bo_data[0] = m_global_wg_size_x; /* num_groups_x */
	helper_bo_data[1] = 1;					/* num_groups_y */
	helper_bo_data[2] = 1;					/* num_groups_z */
	helper_bo_data[3] = 0;					/* default atomic counter value */

	m_gl.genBuffers(1, &m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_ARRAY_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferData(GL_ARRAY_BUFFER, n_helper_bo_bytes, helper_bo_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferData() call failed.");

	/* Set up the test compute program object */
	static const char* cs_body = "#version 430 core\n"
								 "\n"
								 "layout(local_size_x = 1023)          in;\n"
								 "layout(binding      = 0, offset = 0) uniform atomic_uint ac;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    atomicCounterIncrement(ac);\n"
								 "}\n";

	m_po = SparseBufferTestUtilities::createComputeProgram(m_gl, &cs_body, 1); /* n_cs_body_parts */

	result = (m_po != 0);

	return result;
}